

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve.c
# Opt level: O0

int resolve_must(lyd_node *node,int inout_parent,int ignore_fail)

{
  ushort uVar1;
  LYS_NODE LVar2;
  char *expr;
  int iVar3;
  LY_ERR *pLVar4;
  lys_module *plVar5;
  bool bVar6;
  undefined1 local_68 [8];
  lyxp_set set;
  lys_restr *must;
  lys_node *schema;
  uint8_t must_size;
  uint8_t i;
  int node_flags;
  int ignore_fail_local;
  int inout_parent_local;
  lyd_node *node_local;
  
  if (node == (lyd_node *)0x0) {
    __assert_fail("node",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/resolve.c"
                  ,0x160e,"int resolve_must(struct lyd_node *, int, int)");
  }
  memset(local_68,0,0x30);
  if (inout_parent != 0) {
    must = (lys_restr *)lys_parent(node->schema);
    while( true ) {
      bVar6 = false;
      if (must != (lys_restr *)0x0) {
        bVar6 = ((ulong)must[1].expr & 0x1042) != 0;
      }
      if (!bVar6) break;
      must = (lys_restr *)lys_parent((lys_node *)must);
    }
    if ((must == (lys_restr *)0x0) || (((ulong)must[1].expr & 0x600) == 0)) {
      pLVar4 = ly_errno_location();
      *pLVar4 = LY_EINT;
      ly_log(LY_LLERR,"Internal error (%s:%d).",
             "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/resolve.c"
             ,0x1616);
      return -1;
    }
    schema._2_1_ = *(byte *)((long)&must->eapptag + 7);
    set._40_8_ = must[2].expr;
    uVar1 = *(ushort *)&must->eapptag;
    _ignore_fail_local = node->parent;
    if ((_ignore_fail_local->schema->nodetype & (LYS_ACTION|LYS_RPC)) == LYS_UNKNOWN) {
      pLVar4 = ly_errno_location();
      *pLVar4 = LY_EINT;
      ly_log(LY_LLERR,"Internal error (%s:%d).",
             "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/resolve.c"
             ,0x1621);
      return -1;
    }
    goto LAB_0011f6da;
  }
  LVar2 = node->schema->nodetype;
  if (LVar2 == LYS_CONTAINER) {
    schema._2_1_ = node->schema->padding[2];
    set._40_8_ = node->schema[1].dsc;
  }
  else if (LVar2 == LYS_LEAF) {
    schema._2_1_ = node->schema->padding[3];
    set._40_8_ = node->schema[1].dsc;
  }
  else if (LVar2 == LYS_LEAFLIST) {
    schema._2_1_ = node->schema->padding[3];
    set._40_8_ = node->schema[1].dsc;
  }
  else if (LVar2 == LYS_LIST) {
    schema._2_1_ = node->schema->padding[0];
    set._40_8_ = node->schema[1].dsc;
  }
  else if (LVar2 == LYS_ANYXML) {
LAB_0011f68c:
    schema._2_1_ = node->schema->padding[3];
    set._40_8_ = node->schema[1].dsc;
  }
  else if (LVar2 == LYS_NOTIF) {
    schema._2_1_ = node->schema->padding[3];
    set._40_8_ = node->schema[1].dsc;
  }
  else {
    if (LVar2 == LYS_ANYDATA) goto LAB_0011f68c;
    schema._2_1_ = 0;
  }
  uVar1 = node->schema->flags;
  _ignore_fail_local = node;
LAB_0011f6da:
  schema._3_1_ = 0;
  while( true ) {
    if (schema._2_1_ <= schema._3_1_) {
      return 0;
    }
    expr = *(char **)(set._40_8_ + (ulong)schema._3_1_ * 0x38);
    plVar5 = lyd_node_module(_ignore_fail_local);
    iVar3 = lyxp_eval(expr,_ignore_fail_local,LYXP_NODE_ELEM,plVar5,(lyxp_set *)local_68,1);
    if (iVar3 != 0) break;
    plVar5 = lyd_node_module(_ignore_fail_local);
    lyxp_set_cast((lyxp_set *)local_68,LYXP_SET_BOOLEAN,_ignore_fail_local,plVar5,1);
    if (set._8_4_ == 0) {
      if ((ignore_fail != 1) && (((uVar1 & 0x200) == 0 || (ignore_fail != 2)))) {
        ly_vlog(LYE_NOMUST,LY_VLOG_LYD,_ignore_fail_local,
                *(undefined8 *)(set._40_8_ + (ulong)schema._3_1_ * 0x38));
        if (*(long *)(set._40_8_ + (ulong)schema._3_1_ * 0x38 + 0x20) != 0) {
          ly_vlog(LYE_SPEC,LY_VLOG_PREV,(void *)0x0,
                  *(undefined8 *)(set._40_8_ + (ulong)schema._3_1_ * 0x38 + 0x20));
        }
        if (*(long *)(set._40_8_ + (ulong)schema._3_1_ * 0x38 + 0x18) != 0) {
          pLVar4 = ly_errno_location();
          strncpy((char *)(pLVar4 + 0x206),
                  *(char **)(set._40_8_ + (ulong)schema._3_1_ * 0x38 + 0x18),0x7f);
        }
        return 1;
      }
      if ('\x01' < ly_log_level) {
        ly_log(LY_LLVRB,"Must condition \"%s\" not satisfied, but it is not required.",
               *(undefined8 *)(set._40_8_ + (ulong)schema._3_1_ * 0x38));
      }
    }
    schema._3_1_ = schema._3_1_ + 1;
  }
  return -1;
}

Assistant:

static int
resolve_must(struct lyd_node *node, int inout_parent, int ignore_fail)
{
    int node_flags;
    uint8_t i, must_size;
    struct lys_node *schema;
    struct lys_restr *must;
    struct lyxp_set set;

    assert(node);
    memset(&set, 0, sizeof set);

    if (inout_parent) {
        for (schema = lys_parent(node->schema);
             schema && (schema->nodetype & (LYS_CHOICE | LYS_CASE | LYS_USES));
             schema = lys_parent(schema));
        if (!schema || !(schema->nodetype & (LYS_INPUT | LYS_OUTPUT))) {
            LOGINT;
            return -1;
        }
        must_size = ((struct lys_node_inout *)schema)->must_size;
        must = ((struct lys_node_inout *)schema)->must;

        node_flags = schema->flags;

        /* context node is the RPC/action */
        node = node->parent;
        if (!(node->schema->nodetype & (LYS_RPC | LYS_ACTION))) {
            LOGINT;
            return -1;
        }
    } else {
        switch (node->schema->nodetype) {
        case LYS_CONTAINER:
            must_size = ((struct lys_node_container *)node->schema)->must_size;
            must = ((struct lys_node_container *)node->schema)->must;
            break;
        case LYS_LEAF:
            must_size = ((struct lys_node_leaf *)node->schema)->must_size;
            must = ((struct lys_node_leaf *)node->schema)->must;
            break;
        case LYS_LEAFLIST:
            must_size = ((struct lys_node_leaflist *)node->schema)->must_size;
            must = ((struct lys_node_leaflist *)node->schema)->must;
            break;
        case LYS_LIST:
            must_size = ((struct lys_node_list *)node->schema)->must_size;
            must = ((struct lys_node_list *)node->schema)->must;
            break;
        case LYS_ANYXML:
        case LYS_ANYDATA:
            must_size = ((struct lys_node_anydata *)node->schema)->must_size;
            must = ((struct lys_node_anydata *)node->schema)->must;
            break;
        case LYS_NOTIF:
            must_size = ((struct lys_node_notif *)node->schema)->must_size;
            must = ((struct lys_node_notif *)node->schema)->must;
            break;
        default:
            must_size = 0;
            break;
        }

        node_flags = node->schema->flags;
    }

    for (i = 0; i < must_size; ++i) {
        if (lyxp_eval(must[i].expr, node, LYXP_NODE_ELEM, lyd_node_module(node), &set, LYXP_MUST)) {
            return -1;
        }

        lyxp_set_cast(&set, LYXP_SET_BOOLEAN, node, lyd_node_module(node), LYXP_MUST);

        if (!set.val.bool) {
            if ((ignore_fail == 1) || ((node_flags & LYS_XPATH_DEP) && (ignore_fail == 2))) {
                LOGVRB("Must condition \"%s\" not satisfied, but it is not required.", must[i].expr);
            } else {
                LOGVAL(LYE_NOMUST, LY_VLOG_LYD, node, must[i].expr);
                if (must[i].emsg) {
                    LOGVAL(LYE_SPEC, LY_VLOG_PREV, NULL, must[i].emsg);
                }
                if (must[i].eapptag) {
                    strncpy(((struct ly_err *)&ly_errno)->apptag, must[i].eapptag, LY_APPTAG_LEN - 1);
                }
                return 1;
            }
        }
    }

    return EXIT_SUCCESS;
}